

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_timidity_mididevice.cpp
# Opt level: O2

int __thiscall TimidityWaveWriterMIDIDevice::Resume(TimidityWaveWriterMIDIDevice *this)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  float writebuffer [4096];
  
  do {
    iVar1 = (*(this->super_TimidityMIDIDevice).super_SoftSynthMIDIDevice.super_MIDIDevice.
              _vptr_MIDIDevice[0x1a])(this,writebuffer,0x4000);
    if ((char)iVar1 == '\0') {
      return 0;
    }
    sVar2 = fwrite(writebuffer,0x4000,1,(FILE *)this->File);
  } while (sVar2 == 1);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  Printf("Could not write entire wave file: %s\n",pcVar4);
  return 1;
}

Assistant:

int TimidityWaveWriterMIDIDevice::Resume()
{
	float writebuffer[4096];

	while (ServiceStream(writebuffer, sizeof(writebuffer)))
	{
		if (fwrite(writebuffer, sizeof(writebuffer), 1, File) != 1)
		{
			Printf("Could not write entire wave file: %s\n", strerror(errno));
			return 1;
		}
	}
	return 0;
}